

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

uint64_t next_pow_of_2(uint64_t num)

{
  ulong uVar1;
  
  uVar1 = num - 1 >> 1 | num - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  uVar1 = uVar1 >> 0x20 | uVar1;
  return uVar1 + 1 + (ulong)(uVar1 == 0);
}

Assistant:

uint64_t next_pow_of_2(uint64_t num) {
    uint64_t n = num - 1;
    n |= n >> 1;
    n |= n >> 2;
    n |= n >> 4;
    n |= n >> 8;
    n |= n >> 16;
    n |= n >> 32;
    // if n is 0 add 1
    n += 1 + (n == 0);
    return n;
}